

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm_int8.h
# Opt level: O2

void ncnn::convolution_im2col_gemm_get_optimal_tile_mnk_int8
               (int M,int N,int K,int *TILE_M,int *TILE_N,int *TILE_K,int nT)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  iVar1 = get_cpu_level2_cache_size();
  if (nT == 0) {
    nT = get_physical_big_cpu_count();
  }
  iVar3 = ((iVar1 + -0x20) / 0x40) * 8;
  if (iVar3 < 9) {
    iVar3 = 8;
  }
  iVar2 = (K + iVar3 + -1) / iVar3;
  iVar2 = (((K + iVar2 + -1) / iVar2 + 7) / 8) * 8;
  if (iVar3 <= iVar2) {
    iVar2 = iVar3;
  }
  *TILE_K = iVar2;
  iVar3 = (M + 0x1f) / 0x20;
  iVar3 = (((iVar3 + M + -1) / iVar3 + 7) / 8) * 8;
  if (iVar3 < 9) {
    iVar3 = 8;
  }
  *TILE_M = iVar3;
  iVar3 = get_physical_cpu_count();
  if (nT <= iVar3) {
    iVar3 = nT;
  }
  uVar6 = iVar3 * *TILE_M;
  iVar3 = (int)(uVar6 + M + -1) / (int)uVar6;
  uVar4 = (((iVar3 + M + -1) / iVar3 + 7) / 8) * 8;
  if ((int)uVar6 <= (int)uVar4) {
    uVar4 = uVar6;
  }
  if (1 < nT) {
    iVar3 = 1;
    if (1 < (int)uVar4 / nT) {
      iVar3 = (int)uVar4 / nT;
    }
    uVar6 = iVar3 + 7U & 0x7ffffff8;
    if ((int)uVar6 < (int)uVar4) {
      uVar4 = uVar6;
    }
  }
  *TILE_M = uVar4;
  if (0 < N) {
    iVar3 = *TILE_K;
    iVar2 = uVar4 << 2;
    if (K <= iVar3) {
      iVar2 = 0;
    }
    uVar5 = (long)(int)(iVar1 - uVar4 * iVar3) / (long)(iVar2 + iVar3);
    uVar4 = (int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) / 8) * 8;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 9) {
      uVar5 = 8;
    }
    uVar4 = (uint)uVar5;
    uVar5 = ((N + uVar4) - 1) / uVar5;
    uVar6 = (int)(((N + (int)uVar5) - 1) / uVar5) + 7U & 0xfffffff8;
    if (uVar4 <= uVar6) {
      uVar6 = uVar4;
    }
    *TILE_N = uVar6;
  }
  return;
}

Assistant:

static void convolution_im2col_gemm_get_optimal_tile_mnk_int8(int M, int N, int K, int& TILE_M, int& TILE_N, int& TILE_K, int nT)
{
    // resolve optimal tile size from cache size
    const int l2_cache_size_int8 = (int)(get_cpu_level2_cache_size() / sizeof(signed char));

    if (nT == 0)
        nT = get_physical_big_cpu_count();

    // solve K
    {
        // try not to split K
#if __AVX512F__
        int tile_size = (l2_cache_size_int8 - 64) / 16;
#elif __AVX__
        int tile_size = (l2_cache_size_int8 - 32) / 8;
#elif __SSE2__
        int tile_size = (l2_cache_size_int8 - 16) / 8;
#else
        int tile_size = (l2_cache_size_int8 - 2) / 3;
#endif

#if __AVX512F__
        TILE_K = std::max(16, tile_size / 16 * 16);
#elif __AVX__
        TILE_K = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
        TILE_K = std::max(8, tile_size / 8 * 8);
#else
        TILE_K = std::max(2, tile_size / 2 * 2);
#endif

        int nn_K = (K + TILE_K - 1) / TILE_K;
#if __AVX512F__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 15) / 16 * 16);
#elif __AVX__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 7) / 8 * 8);
#elif __SSE2__
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 7) / 8 * 8);
#else
        TILE_K = std::min(TILE_K, ((K + nn_K - 1) / nn_K + 1) / 2 * 2);
#endif
    }

    // solve M
    {
#if __AVX512F__
        int nn_M = (M + 63) / 64;
#elif __AVX__
        int nn_M = (M + 31) / 32;
#elif __SSE2__
        int nn_M = (M + 15) / 16;
#else
        int nn_M = (M + 7) / 8;
#endif

#if __AVX512F__
        TILE_M = std::max(16, ((M + nn_M - 1) / nn_M + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::max(8, ((M + nn_M - 1) / nn_M + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::max(4, ((M + nn_M - 1) / nn_M + 3) / 4 * 4);
#else
        TILE_M = std::max(2, ((M + nn_M - 1) / nn_M + 1) / 2 * 2);
#endif
    }

    {
        TILE_M *= std::min(nT, get_physical_cpu_count());

        int nn_M = (M + TILE_M - 1) / TILE_M;
#if __AVX512F__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 15) / 16 * 16);
#elif __AVX__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 7) / 8 * 8);
#elif __SSE2__
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 3) / 4 * 4);
#else
        TILE_M = std::min(TILE_M, ((M + nn_M - 1) / nn_M + 1) / 2 * 2);
#endif

        if (nT > 1)
        {
#if __AVX512F__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 15) / 16 * 16);
#elif __AVX__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 7) / 8 * 8);
#elif __SSE2__
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 3) / 4 * 4);
#else
            TILE_M = std::min(TILE_M, (std::max(1, TILE_M / nT) + 1) / 2 * 2);
#endif
        }
    }

    if (N > 0)
    {
        int tile_size;
        if (TILE_K >= K)
        {
            tile_size = (l2_cache_size_int8 - TILE_M * TILE_K) / TILE_K;
        }
        else
        {
            tile_size = (l2_cache_size_int8 - TILE_M * TILE_K) / (TILE_M * 4 + TILE_K);
        }

#if __AVX512F__
        TILE_N = std::max(15, tile_size / 16 * 16);
#elif __AVX__
        TILE_N = std::max(8, tile_size / 8 * 8);
#elif __SSE2__
        TILE_N = std::max(4, tile_size / 4 * 4);
#else
        TILE_N = std::max(1, tile_size);
#endif

        int nn_N = (N + TILE_N - 1) / TILE_N;
#if __AVX512F__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 15) / 16 * 16);
#elif __AVX__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 7) / 8 * 8);
#elif __SSE2__
        TILE_N = std::min(TILE_N, ((N + nn_N - 1) / nn_N + 3) / 4 * 4);
#else
        TILE_N = std::min(TILE_N, (N + nn_N - 1) / nn_N);
#endif
    }
}